

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

timestamp_ms_t
duckdb::Cast::Operation<duckdb::timestamp_tz_t,_duckdb::timestamp_ms_t>(timestamp_tz_t input)

{
  bool bVar1;
  string *msg;
  undefined8 in_RDI;
  timestamp_tz_t unaff_retaddr;
  timestamp_ms_t result;
  timestamp_tz_t in_stack_000001a8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  timestamp_t in_stack_fffffffffffffff8;
  
  bVar1 = TryCast::Operation<duckdb::timestamp_tz_t,_duckdb::timestamp_ms_t>
                    (unaff_retaddr,(timestamp_ms_t *)in_stack_fffffffffffffff8.value,
                     SUB81((ulong)in_RDI >> 0x38,0));
  if (!bVar1) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
    msg = (string *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::timestamp_tz_t,_duckdb::timestamp_ms_t>(in_stack_000001a8);
    InvalidInputException::InvalidInputException
              ((InvalidInputException *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),msg);
    __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
  }
  return (timestamp_ms_t)(timestamp_t)in_stack_fffffffffffffff8.value;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}